

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients<short,short>(random_numerators<short> *vals,short *div)

{
  short *psVar1;
  long lVar2;
  uint uVar3;
  
  if ((ulong)vals->_length != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      psVar1 = (short *)((long)vals->_pData + lVar2);
      lVar2 = lVar2 + 2;
      uVar3 = uVar3 + (int)*psVar1 / (int)*div;
    } while ((ulong)vals->_length * 2 != lVar2);
    return (ulong)(uVar3 & 0xffff);
  }
  return 0;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}